

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_transverse_3D_K.H
# Opt level: O0

void create_transverse_terms_for_yface
               (int i,int jc,int k,Array4<const_double> *u_ad,Array4<const_double> *w_ad,
               Array4<const_double> *xzlo,Array4<const_double> *zxlo,Array4<const_double> *apx,
               Array4<const_double> *apz,Array4<const_double> *fcx,Array4<const_double> *fcz,
               Real *trans_x,Real *trans_z,Real dx,Real dz)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  long *in_RCX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  long *in_R8;
  long *in_R9;
  ulong uVar5;
  double in_XMM0_Qa;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double in_XMM1_Qa;
  Real h1_3;
  Real v1_3;
  Real y1_3;
  Real x1_1;
  Real h0_3;
  Real v0_3;
  Real y0_3;
  Real x0_1;
  Real yoff_3;
  Real xoff_1;
  int jj_3;
  int ii_1;
  int kc_3;
  int ic_3;
  Real h3_2;
  Real v3_2;
  Real y3_2;
  Real x3;
  Real h2_2;
  Real v2_2;
  Real y2_2;
  Real x2;
  Real h1_2;
  Real v1_2;
  Real y1_2;
  Real x1;
  Real h0_2;
  Real v0_2;
  Real y0_2;
  Real x0;
  Real yoff_2;
  Real xoff;
  int jj_2;
  int ii;
  int kc_2;
  int ic_2;
  Real h3_1;
  Real v3_1;
  Real z3_1;
  Real y3_1;
  Real h2_1;
  Real v2_1;
  Real z2_1;
  Real y2_1;
  Real h1_1;
  Real v1_1;
  Real z1_1;
  Real y1_1;
  Real h0_1;
  Real v0_1;
  Real z0_1;
  Real y0_1;
  Real zoff_1;
  Real yoff_1;
  int kk_1;
  int jj_1;
  int kc_1;
  int ic_1;
  Real h3;
  Real v3;
  Real z3;
  Real y3;
  Real h2;
  Real v2;
  Real z2;
  Real y2;
  Real h1;
  Real v1;
  Real z1;
  Real y1;
  Real h0;
  Real v0;
  Real z0;
  Real y0;
  Real zoff;
  Real yoff;
  int kk;
  int jj;
  int kc;
  int ic;
  Real z_hat_kp1;
  Real z_hat_k;
  Real x_hat_ip1;
  Real x_hat_i;
  Real w_tmp_kp1;
  Real w_tmp_k;
  Real u_tmp_ip1;
  Real u_tmp_i;
  Real value_7;
  Real det_7;
  Real xyder_7;
  Real yder_7;
  Real xder_7;
  Real yc_7;
  Real yb_7;
  Real ya_7;
  Real xc_7;
  Real xb_7;
  Real xa_7;
  Real vc_7;
  Real vb_7;
  Real va_7;
  Real value_6;
  Real det_6;
  Real xyder_6;
  Real yder_6;
  Real xder_6;
  Real yc_6;
  Real yb_6;
  Real ya_6;
  Real xc_6;
  Real xb_6;
  Real xa_6;
  Real vc_6;
  Real vb_6;
  Real va_6;
  Real value_5;
  Real det_5;
  Real xyder_5;
  Real yder_5;
  Real xder_5;
  Real yc_5;
  Real yb_5;
  Real ya_5;
  Real xc_5;
  Real xb_5;
  Real xa_5;
  Real vc_5;
  Real vb_5;
  Real va_5;
  Real value_4;
  Real det_4;
  Real xyder_4;
  Real yder_4;
  Real xder_4;
  Real yc_4;
  Real yb_4;
  Real ya_4;
  Real xc_4;
  Real xb_4;
  Real xa_4;
  Real vc_4;
  Real vb_4;
  Real va_4;
  Real value_3;
  Real det_3;
  Real xyder_3;
  Real yder_3;
  Real xder_3;
  Real yc_3;
  Real yb_3;
  Real ya_3;
  Real xc_3;
  Real xb_3;
  Real xa_3;
  Real vc_3;
  Real vb_3;
  Real va_3;
  Real value_2;
  Real det_2;
  Real xyder_2;
  Real yder_2;
  Real xder_2;
  Real yc_2;
  Real yb_2;
  Real ya_2;
  Real xc_2;
  Real xb_2;
  Real xa_2;
  Real vc_2;
  Real vb_2;
  Real va_2;
  Real value_1;
  Real det_1;
  Real xyder_1;
  Real yder_1;
  Real xder_1;
  Real yc_1;
  Real yb_1;
  Real ya_1;
  Real xc_1;
  Real xb_1;
  Real xa_1;
  Real vc_1;
  Real vb_1;
  Real va_1;
  Real value;
  Real det;
  Real xyder;
  Real yder;
  Real xder;
  Real yc;
  Real yb;
  Real ya;
  Real xc;
  Real xb;
  Real xa;
  Real vc;
  Real vb;
  Real va;
  int local_12d0;
  int local_12cc;
  int local_12c8;
  int local_12c4;
  int local_12c0;
  int local_12bc;
  int local_12b8;
  int local_12b4;
  double local_1010;
  double local_1008;
  double local_1000;
  double local_ff8;
  double local_ff0;
  double local_fe8;
  double local_fe0;
  double local_fd8;
  Real dudz_l;
  Real w_tmp_l;
  Real dudx_l;
  Real u_tmp_l;
  Real h3_3;
  Real v3_3;
  Real y3_3;
  Real x3_1;
  Real h2_3;
  Real v2_3;
  Real y2_3;
  Real x2_1;
  
  dVar1 = *(double *)
           (*(long *)y1_3 +
           ((long)(in_EDI - *(int *)((long)y1_3 + 0x20)) +
            (long)(in_ESI - *(int *)((long)y1_3 + 0x24)) * *(long *)((long)y1_3 + 8) +
           (long)(in_EDX - *(int *)((long)y1_3 + 0x28)) * *(long *)((long)y1_3 + 0x10)) * 8);
  if ((dVar1 != 1.0) || (NAN(dVar1))) {
    if (0.0 < *(double *)
               (*(long *)h0_3 +
               ((long)(in_EDI - *(int *)((long)h0_3 + 0x20)) +
                (long)(in_ESI - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
               (long)(in_EDX - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10)) * 8)) {
      local_12b4 = in_ESI + 1;
    }
    else {
      local_12b4 = in_ESI + -1;
    }
    if (0.0 < *(double *)
               (*(long *)h0_3 +
               ((long)(in_EDI - *(int *)((long)h0_3 + 0x20)) +
                (long)(in_ESI - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
                (long)(in_EDX - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10) +
               *(long *)((long)h0_3 + 0x18)) * 8)) {
      local_12b8 = in_EDX + 1;
    }
    else {
      local_12b8 = in_EDX + -1;
    }
    uVar5 = -(ulong)(*(double *)
                      (*(long *)h0_3 +
                      ((long)(in_EDI - *(int *)((long)h0_3 + 0x20)) +
                       (long)(in_ESI - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
                      (long)(in_EDX - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10)) *
                      8) <= 0.0);
    dVar8 = (double)(~uVar5 & 0x3ff0000000000000 | uVar5 & 0xbff0000000000000);
    uVar5 = -(ulong)(*(double *)
                      (*(long *)h0_3 +
                      ((long)(in_EDI - *(int *)((long)h0_3 + 0x20)) +
                       (long)(in_ESI - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
                       (long)(in_EDX - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10) +
                      *(long *)((long)h0_3 + 0x18)) * 8) <= 0.0);
    dVar9 = (double)(~uVar5 & 0x3ff0000000000000 | uVar5 & 0xbff0000000000000);
    dVar1 = *(double *)
             (*(long *)h0_3 +
             ((long)(in_EDI - *(int *)((long)h0_3 + 0x20)) +
              (long)(in_ESI - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
             (long)(in_EDX - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10)) * 8);
    dVar2 = *(double *)
             (*(long *)h0_3 +
             ((long)(in_EDI - *(int *)((long)h0_3 + 0x20)) +
              (long)(in_ESI - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
              (long)(in_EDX - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10) +
             *(long *)((long)h0_3 + 0x18)) * 8);
    dVar20 = *(double *)
              (*in_RCX +
              ((long)(in_EDI - (int)in_RCX[4]) +
               (long)(in_ESI - *(int *)((long)in_RCX + 0x24)) * in_RCX[1] +
              (long)(in_EDX - (int)in_RCX[5]) * in_RCX[2]) * 8);
    dVar3 = *(double *)
             (*in_R9 + ((long)(in_EDI - (int)in_R9[4]) +
                        (long)(in_ESI - *(int *)((long)in_R9 + 0x24)) * in_R9[1] +
                       (long)(in_EDX - (int)in_R9[5]) * in_R9[2]) * 8);
    dVar6 = *(double *)
             (*(long *)h0_3 +
             ((long)(in_EDI - *(int *)((long)h0_3 + 0x20)) +
              (long)(local_12b4 - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
             (long)(in_EDX - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10)) * 8) +
            dVar8;
    dVar22 = *(double *)
              (*(long *)h0_3 +
              ((long)(in_EDI - *(int *)((long)h0_3 + 0x20)) +
               (long)(local_12b4 - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
               (long)(in_EDX - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10) +
              *(long *)((long)h0_3 + 0x18)) * 8);
    dVar21 = *(double *)
              (*(long *)h0_3 +
              ((long)(in_EDI - *(int *)((long)h0_3 + 0x20)) +
               (long)(in_ESI - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
              (long)(local_12b8 - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10)) * 8);
    dVar7 = *(double *)
             (*(long *)h0_3 +
             ((long)(in_EDI - *(int *)((long)h0_3 + 0x20)) +
              (long)(in_ESI - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
              (long)(local_12b8 - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10) +
             *(long *)((long)h0_3 + 0x18)) * 8) + dVar9;
    dVar8 = *(double *)
             (*(long *)h0_3 +
             ((long)(in_EDI - *(int *)((long)h0_3 + 0x20)) +
              (long)(local_12b4 - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
             (long)(local_12b8 - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10)) * 8) +
            dVar8;
    dVar9 = *(double *)
             (*(long *)h0_3 +
             ((long)(in_EDI - *(int *)((long)h0_3 + 0x20)) +
              (long)(local_12b4 - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
              (long)(local_12b8 - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10) +
             *(long *)((long)h0_3 + 0x18)) * 8) + dVar9;
    dVar10 = *(double *)
              (*in_RCX +
              ((long)(in_EDI - (int)in_RCX[4]) +
               (long)(local_12b4 - *(int *)((long)in_RCX + 0x24)) * in_RCX[1] +
              (long)(local_12b8 - (int)in_RCX[5]) * in_RCX[2]) * 8) - dVar20;
    dVar11 = *(double *)
              (*in_RCX +
              ((long)(in_EDI - (int)in_RCX[4]) +
               (long)(in_ESI - *(int *)((long)in_RCX + 0x24)) * in_RCX[1] +
              (long)(local_12b8 - (int)in_RCX[5]) * in_RCX[2]) * 8) - dVar20;
    dVar12 = *(double *)
              (*in_RCX +
              ((long)(in_EDI - (int)in_RCX[4]) +
               (long)(local_12b4 - *(int *)((long)in_RCX + 0x24)) * in_RCX[1] +
              (long)(in_EDX - (int)in_RCX[5]) * in_RCX[2]) * 8) - dVar20;
    dVar13 = dVar8 - dVar1;
    dVar14 = dVar21 - dVar1;
    dVar15 = dVar6 - dVar1;
    dVar16 = dVar9 - dVar2;
    dVar17 = dVar7 - dVar2;
    dVar18 = dVar22 - dVar2;
    dVar19 = dVar13 * dVar15 * dVar17 * dVar18 +
             -(dVar13 * dVar14 * dVar17) * dVar18 +
             -(dVar14 * dVar15 * dVar16) * dVar18 +
             dVar13 * dVar14 * dVar16 * dVar18 +
             -(dVar13 * dVar15 * dVar16) * dVar17 + dVar14 * dVar15 * dVar16 * dVar17;
    local_fd8 = ((dVar10 * dVar14 * dVar18 +
                 -(dVar11 * dVar13) * dVar18 +
                 -(dVar10 * dVar15) * dVar17 +
                 dVar12 * dVar13 * dVar17 + -(dVar12 * dVar14) * dVar16 + dVar11 * dVar15 * dVar16)
                / dVar19) * (0.0 - dVar1) * (0.0 - dVar2) +
                ((dVar11 * dVar13 * dVar15 * (-dVar16 + dVar18) +
                 dVar12 * dVar13 * dVar14 * (dVar16 - dVar17) +
                 dVar10 * dVar14 * dVar15 * (dVar17 - dVar18)) / dVar19) * (0.0 - dVar2) +
                ((dVar10 * (-dVar14 + dVar15) * dVar17 * dVar18 +
                 dVar12 * (-dVar13 + dVar14) * dVar16 * dVar17 +
                 dVar11 * (dVar13 - dVar15) * dVar16 * dVar18) / dVar19) * (0.0 - dVar1) + dVar20;
    dVar20 = *(double *)
              (*in_R9 + ((long)(in_EDI - (int)in_R9[4]) +
                         (long)(local_12b4 - *(int *)((long)in_R9 + 0x24)) * in_R9[1] +
                        (long)(local_12b8 - (int)in_R9[5]) * in_R9[2]) * 8) - dVar3;
    dVar10 = *(double *)
              (*in_R9 + ((long)(in_EDI - (int)in_R9[4]) +
                         (long)(in_ESI - *(int *)((long)in_R9 + 0x24)) * in_R9[1] +
                        (long)(local_12b8 - (int)in_R9[5]) * in_R9[2]) * 8) - dVar3;
    dVar11 = *(double *)
              (*in_R9 + ((long)(in_EDI - (int)in_R9[4]) +
                         (long)(local_12b4 - *(int *)((long)in_R9 + 0x24)) * in_R9[1] +
                        (long)(in_EDX - (int)in_R9[5]) * in_R9[2]) * 8) - dVar3;
    dVar8 = dVar8 - dVar1;
    dVar21 = dVar21 - dVar1;
    dVar6 = dVar6 - dVar1;
    dVar9 = dVar9 - dVar2;
    dVar7 = dVar7 - dVar2;
    dVar22 = dVar22 - dVar2;
    dVar12 = dVar8 * dVar6 * dVar7 * dVar22 +
             -(dVar8 * dVar21 * dVar7) * dVar22 +
             -(dVar21 * dVar6 * dVar9) * dVar22 +
             dVar8 * dVar21 * dVar9 * dVar22 +
             -(dVar8 * dVar6 * dVar9) * dVar7 + dVar21 * dVar6 * dVar9 * dVar7;
    local_ff8 = ((dVar20 * dVar21 * dVar22 +
                 -(dVar10 * dVar8) * dVar22 +
                 -(dVar20 * dVar6) * dVar7 +
                 dVar11 * dVar8 * dVar7 + -(dVar11 * dVar21) * dVar9 + dVar10 * dVar6 * dVar9) /
                dVar12) * (0.0 - dVar1) * (0.0 - dVar2) +
                ((dVar10 * dVar8 * dVar6 * (-dVar9 + dVar22) +
                 dVar11 * dVar8 * dVar21 * (dVar9 - dVar7) +
                 dVar20 * dVar21 * dVar6 * (dVar7 - dVar22)) / dVar12) * (0.0 - dVar2) +
                ((dVar20 * (-dVar21 + dVar6) * dVar7 * dVar22 +
                 dVar11 * (-dVar8 + dVar21) * dVar9 * dVar7 +
                 dVar10 * (dVar8 - dVar6) * dVar9 * dVar22) / dVar12) * (0.0 - dVar1) + dVar3;
  }
  else {
    local_fd8 = *(double *)
                 (*in_RCX +
                 ((long)(in_EDI - (int)in_RCX[4]) +
                  (long)(in_ESI - *(int *)((long)in_RCX + 0x24)) * in_RCX[1] +
                 (long)(in_EDX - (int)in_RCX[5]) * in_RCX[2]) * 8);
    local_ff8 = *(double *)
                 (*in_R9 + ((long)(in_EDI - (int)in_R9[4]) +
                            (long)(in_ESI - *(int *)((long)in_R9 + 0x24)) * in_R9[1] +
                           (long)(in_EDX - (int)in_R9[5]) * in_R9[2]) * 8);
  }
  dVar1 = *(double *)
           (*(long *)y1_3 +
           ((long)((in_EDI + 1) - *(int *)((long)y1_3 + 0x20)) +
            (long)(in_ESI - *(int *)((long)y1_3 + 0x24)) * *(long *)((long)y1_3 + 8) +
           (long)(in_EDX - *(int *)((long)y1_3 + 0x28)) * *(long *)((long)y1_3 + 0x10)) * 8);
  if ((dVar1 != 1.0) || (NAN(dVar1))) {
    iVar4 = in_EDI + 1;
    if (0.0 < *(double *)
               (*(long *)h0_3 +
               ((long)(iVar4 - *(int *)((long)h0_3 + 0x20)) +
                (long)(in_ESI - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
               (long)(in_EDX - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10)) * 8)) {
      local_12bc = in_ESI + 1;
    }
    else {
      local_12bc = in_ESI + -1;
    }
    if (0.0 < *(double *)
               (*(long *)h0_3 +
               ((long)(iVar4 - *(int *)((long)h0_3 + 0x20)) +
                (long)(in_ESI - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
                (long)(in_EDX - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10) +
               *(long *)((long)h0_3 + 0x18)) * 8)) {
      local_12c0 = in_EDX + 1;
    }
    else {
      local_12c0 = in_EDX + -1;
    }
    uVar5 = -(ulong)(*(double *)
                      (*(long *)h0_3 +
                      ((long)(iVar4 - *(int *)((long)h0_3 + 0x20)) +
                       (long)(in_ESI - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
                      (long)(in_EDX - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10)) *
                      8) <= 0.0);
    dVar8 = (double)(~uVar5 & 0x3ff0000000000000 | uVar5 & 0xbff0000000000000);
    uVar5 = -(ulong)(*(double *)
                      (*(long *)h0_3 +
                      ((long)(iVar4 - *(int *)((long)h0_3 + 0x20)) +
                       (long)(in_ESI - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
                       (long)(in_EDX - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10) +
                      *(long *)((long)h0_3 + 0x18)) * 8) <= 0.0);
    dVar9 = (double)(~uVar5 & 0x3ff0000000000000 | uVar5 & 0xbff0000000000000);
    dVar1 = *(double *)
             (*(long *)h0_3 +
             ((long)(iVar4 - *(int *)((long)h0_3 + 0x20)) +
              (long)(in_ESI - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
             (long)(in_EDX - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10)) * 8);
    dVar2 = *(double *)
             (*(long *)h0_3 +
             ((long)(iVar4 - *(int *)((long)h0_3 + 0x20)) +
              (long)(in_ESI - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
              (long)(in_EDX - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10) +
             *(long *)((long)h0_3 + 0x18)) * 8);
    dVar20 = *(double *)
              (*in_RCX +
              ((long)(iVar4 - (int)in_RCX[4]) +
               (long)(in_ESI - *(int *)((long)in_RCX + 0x24)) * in_RCX[1] +
              (long)(in_EDX - (int)in_RCX[5]) * in_RCX[2]) * 8);
    dVar3 = *(double *)
             (*in_R9 + ((long)(iVar4 - (int)in_R9[4]) +
                        (long)(in_ESI - *(int *)((long)in_R9 + 0x24)) * in_R9[1] +
                       (long)(in_EDX - (int)in_R9[5]) * in_R9[2]) * 8);
    dVar6 = *(double *)
             (*(long *)h0_3 +
             ((long)(iVar4 - *(int *)((long)h0_3 + 0x20)) +
              (long)(local_12bc - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
             (long)(in_EDX - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10)) * 8) +
            dVar8;
    dVar22 = *(double *)
              (*(long *)h0_3 +
              ((long)(iVar4 - *(int *)((long)h0_3 + 0x20)) +
               (long)(local_12bc - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
               (long)(in_EDX - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10) +
              *(long *)((long)h0_3 + 0x18)) * 8);
    dVar21 = *(double *)
              (*(long *)h0_3 +
              ((long)(iVar4 - *(int *)((long)h0_3 + 0x20)) +
               (long)(in_ESI - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
              (long)(local_12c0 - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10)) * 8);
    dVar7 = *(double *)
             (*(long *)h0_3 +
             ((long)(iVar4 - *(int *)((long)h0_3 + 0x20)) +
              (long)(in_ESI - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
              (long)(local_12c0 - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10) +
             *(long *)((long)h0_3 + 0x18)) * 8) + dVar9;
    dVar8 = *(double *)
             (*(long *)h0_3 +
             ((long)(iVar4 - *(int *)((long)h0_3 + 0x20)) +
              (long)(local_12bc - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
             (long)(local_12c0 - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10)) * 8) +
            dVar8;
    dVar9 = *(double *)
             (*(long *)h0_3 +
             ((long)(iVar4 - *(int *)((long)h0_3 + 0x20)) +
              (long)(local_12bc - *(int *)((long)h0_3 + 0x24)) * *(long *)((long)h0_3 + 8) +
              (long)(local_12c0 - *(int *)((long)h0_3 + 0x28)) * *(long *)((long)h0_3 + 0x10) +
             *(long *)((long)h0_3 + 0x18)) * 8) + dVar9;
    dVar10 = *(double *)
              (*in_RCX +
              ((long)(iVar4 - (int)in_RCX[4]) +
               (long)(local_12bc - *(int *)((long)in_RCX + 0x24)) * in_RCX[1] +
              (long)(local_12c0 - (int)in_RCX[5]) * in_RCX[2]) * 8) - dVar20;
    dVar11 = *(double *)
              (*in_RCX +
              ((long)(iVar4 - (int)in_RCX[4]) +
               (long)(in_ESI - *(int *)((long)in_RCX + 0x24)) * in_RCX[1] +
              (long)(local_12c0 - (int)in_RCX[5]) * in_RCX[2]) * 8) - dVar20;
    dVar12 = *(double *)
              (*in_RCX +
              ((long)(iVar4 - (int)in_RCX[4]) +
               (long)(local_12bc - *(int *)((long)in_RCX + 0x24)) * in_RCX[1] +
              (long)(in_EDX - (int)in_RCX[5]) * in_RCX[2]) * 8) - dVar20;
    dVar13 = dVar8 - dVar1;
    dVar14 = dVar21 - dVar1;
    dVar15 = dVar6 - dVar1;
    dVar16 = dVar9 - dVar2;
    dVar17 = dVar7 - dVar2;
    dVar18 = dVar22 - dVar2;
    dVar19 = dVar13 * dVar15 * dVar17 * dVar18 +
             -(dVar13 * dVar14 * dVar17) * dVar18 +
             -(dVar14 * dVar15 * dVar16) * dVar18 +
             dVar13 * dVar14 * dVar16 * dVar18 +
             -(dVar13 * dVar15 * dVar16) * dVar17 + dVar14 * dVar15 * dVar16 * dVar17;
    local_fe0 = ((dVar10 * dVar14 * dVar18 +
                 -(dVar11 * dVar13) * dVar18 +
                 -(dVar10 * dVar15) * dVar17 +
                 dVar12 * dVar13 * dVar17 + -(dVar12 * dVar14) * dVar16 + dVar11 * dVar15 * dVar16)
                / dVar19) * (0.0 - dVar1) * (0.0 - dVar2) +
                ((dVar11 * dVar13 * dVar15 * (-dVar16 + dVar18) +
                 dVar12 * dVar13 * dVar14 * (dVar16 - dVar17) +
                 dVar10 * dVar14 * dVar15 * (dVar17 - dVar18)) / dVar19) * (0.0 - dVar2) +
                ((dVar10 * (-dVar14 + dVar15) * dVar17 * dVar18 +
                 dVar12 * (-dVar13 + dVar14) * dVar16 * dVar17 +
                 dVar11 * (dVar13 - dVar15) * dVar16 * dVar18) / dVar19) * (0.0 - dVar1) + dVar20;
    dVar20 = *(double *)
              (*in_R9 + ((long)(iVar4 - (int)in_R9[4]) +
                         (long)(local_12bc - *(int *)((long)in_R9 + 0x24)) * in_R9[1] +
                        (long)(local_12c0 - (int)in_R9[5]) * in_R9[2]) * 8) - dVar3;
    dVar10 = *(double *)
              (*in_R9 + ((long)(iVar4 - (int)in_R9[4]) +
                         (long)(in_ESI - *(int *)((long)in_R9 + 0x24)) * in_R9[1] +
                        (long)(local_12c0 - (int)in_R9[5]) * in_R9[2]) * 8) - dVar3;
    dVar11 = *(double *)
              (*in_R9 + ((long)(iVar4 - (int)in_R9[4]) +
                         (long)(local_12bc - *(int *)((long)in_R9 + 0x24)) * in_R9[1] +
                        (long)(in_EDX - (int)in_R9[5]) * in_R9[2]) * 8) - dVar3;
    dVar8 = dVar8 - dVar1;
    dVar21 = dVar21 - dVar1;
    dVar6 = dVar6 - dVar1;
    dVar9 = dVar9 - dVar2;
    dVar7 = dVar7 - dVar2;
    dVar22 = dVar22 - dVar2;
    dVar12 = dVar8 * dVar6 * dVar7 * dVar22 +
             -(dVar8 * dVar21 * dVar7) * dVar22 +
             -(dVar21 * dVar6 * dVar9) * dVar22 +
             dVar8 * dVar21 * dVar9 * dVar22 +
             -(dVar8 * dVar6 * dVar9) * dVar7 + dVar21 * dVar6 * dVar9 * dVar7;
    local_1000 = ((dVar20 * dVar21 * dVar22 +
                  -(dVar10 * dVar8) * dVar22 +
                  -(dVar20 * dVar6) * dVar7 +
                  dVar11 * dVar8 * dVar7 + -(dVar11 * dVar21) * dVar9 + dVar10 * dVar6 * dVar9) /
                 dVar12) * (0.0 - dVar1) * (0.0 - dVar2) +
                 ((dVar10 * dVar8 * dVar6 * (-dVar9 + dVar22) +
                  dVar11 * dVar8 * dVar21 * (dVar9 - dVar7) +
                  dVar20 * dVar21 * dVar6 * (dVar7 - dVar22)) / dVar12) * (0.0 - dVar2) +
                 ((dVar20 * (-dVar21 + dVar6) * dVar7 * dVar22 +
                  dVar11 * (-dVar8 + dVar21) * dVar9 * dVar7 +
                  dVar10 * (dVar8 - dVar6) * dVar9 * dVar22) / dVar12) * (0.0 - dVar1) + dVar3;
  }
  else {
    local_fe0 = *(double *)
                 (*in_RCX +
                 ((long)((in_EDI + 1) - (int)in_RCX[4]) +
                  (long)(in_ESI - *(int *)((long)in_RCX + 0x24)) * in_RCX[1] +
                 (long)(in_EDX - (int)in_RCX[5]) * in_RCX[2]) * 8);
    local_1000 = *(double *)
                  (*in_R9 + ((long)((in_EDI + 1) - (int)in_R9[4]) +
                             (long)(in_ESI - *(int *)((long)in_R9 + 0x24)) * in_R9[1] +
                            (long)(in_EDX - (int)in_R9[5]) * in_R9[2]) * 8);
  }
  dVar1 = *(double *)
           (*(long *)x1_1 +
           ((long)(in_EDI - *(int *)((long)x1_1 + 0x20)) +
            (long)(in_ESI - *(int *)((long)x1_1 + 0x24)) * *(long *)((long)x1_1 + 8) +
           (long)(in_EDX - *(int *)((long)x1_1 + 0x28)) * *(long *)((long)x1_1 + 0x10)) * 8);
  if ((dVar1 != 1.0) || (NAN(dVar1))) {
    if (0.0 < *(double *)
               (*(long *)v0_3 +
               ((long)(in_EDI - *(int *)((long)v0_3 + 0x20)) +
                (long)(in_ESI - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
               (long)(in_EDX - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10)) * 8)) {
      local_12c4 = in_EDI + 1;
    }
    else {
      local_12c4 = in_EDI + -1;
    }
    if (0.0 < *(double *)
               (*(long *)v0_3 +
               ((long)(in_EDI - *(int *)((long)v0_3 + 0x20)) +
                (long)(in_ESI - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
                (long)(in_EDX - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10) +
               *(long *)((long)v0_3 + 0x18)) * 8)) {
      local_12c8 = in_ESI + 1;
    }
    else {
      local_12c8 = in_ESI + -1;
    }
    uVar5 = -(ulong)(*(double *)
                      (*(long *)v0_3 +
                      ((long)(in_EDI - *(int *)((long)v0_3 + 0x20)) +
                       (long)(in_ESI - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
                      (long)(in_EDX - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10)) *
                      8) <= 0.0);
    dVar8 = (double)(~uVar5 & 0x3ff0000000000000 | uVar5 & 0xbff0000000000000);
    uVar5 = -(ulong)(*(double *)
                      (*(long *)v0_3 +
                      ((long)(in_EDI - *(int *)((long)v0_3 + 0x20)) +
                       (long)(in_ESI - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
                       (long)(in_EDX - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10) +
                      *(long *)((long)v0_3 + 0x18)) * 8) <= 0.0);
    dVar9 = (double)(~uVar5 & 0x3ff0000000000000 | uVar5 & 0xbff0000000000000);
    dVar1 = *(double *)
             (*(long *)v0_3 +
             ((long)(in_EDI - *(int *)((long)v0_3 + 0x20)) +
              (long)(in_ESI - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
             (long)(in_EDX - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10)) * 8);
    dVar2 = *(double *)
             (*(long *)v0_3 +
             ((long)(in_EDI - *(int *)((long)v0_3 + 0x20)) +
              (long)(in_ESI - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
              (long)(in_EDX - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10) +
             *(long *)((long)v0_3 + 0x18)) * 8);
    dVar20 = *(double *)
              (*in_R8 + ((long)(in_EDI - (int)in_R8[4]) +
                         (long)(in_ESI - *(int *)((long)in_R8 + 0x24)) * in_R8[1] +
                        (long)(in_EDX - (int)in_R8[5]) * in_R8[2]) * 8);
    dVar3 = *(double *)
             (*(long *)v1_3 +
             ((long)(in_EDI - *(int *)((long)v1_3 + 0x20)) +
              (long)(in_ESI - *(int *)((long)v1_3 + 0x24)) * *(long *)((long)v1_3 + 8) +
             (long)(in_EDX - *(int *)((long)v1_3 + 0x28)) * *(long *)((long)v1_3 + 0x10)) * 8);
    dVar6 = *(double *)
             (*(long *)v0_3 +
             ((long)(local_12c4 - *(int *)((long)v0_3 + 0x20)) +
              (long)(in_ESI - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
             (long)(in_EDX - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10)) * 8) +
            dVar8;
    dVar22 = *(double *)
              (*(long *)v0_3 +
              ((long)(local_12c4 - *(int *)((long)v0_3 + 0x20)) +
               (long)(in_ESI - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
               (long)(in_EDX - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10) +
              *(long *)((long)v0_3 + 0x18)) * 8);
    dVar21 = *(double *)
              (*(long *)v0_3 +
              ((long)(in_EDI - *(int *)((long)v0_3 + 0x20)) +
               (long)(local_12c8 - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
              (long)(in_EDX - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10)) * 8);
    dVar7 = *(double *)
             (*(long *)v0_3 +
             ((long)(in_EDI - *(int *)((long)v0_3 + 0x20)) +
              (long)(local_12c8 - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
              (long)(in_EDX - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10) +
             *(long *)((long)v0_3 + 0x18)) * 8) + dVar9;
    dVar8 = *(double *)
             (*(long *)v0_3 +
             ((long)(local_12c4 - *(int *)((long)v0_3 + 0x20)) +
              (long)(local_12c8 - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
             (long)(in_EDX - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10)) * 8) +
            dVar8;
    dVar9 = *(double *)
             (*(long *)v0_3 +
             ((long)(local_12c4 - *(int *)((long)v0_3 + 0x20)) +
              (long)(local_12c8 - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
              (long)(in_EDX - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10) +
             *(long *)((long)v0_3 + 0x18)) * 8) + dVar9;
    dVar10 = *(double *)
              (*in_R8 + ((long)(local_12c4 - (int)in_R8[4]) +
                         (long)(local_12c8 - *(int *)((long)in_R8 + 0x24)) * in_R8[1] +
                        (long)(in_EDX - (int)in_R8[5]) * in_R8[2]) * 8) - dVar20;
    dVar11 = *(double *)
              (*in_R8 + ((long)(in_EDI - (int)in_R8[4]) +
                         (long)(local_12c8 - *(int *)((long)in_R8 + 0x24)) * in_R8[1] +
                        (long)(in_EDX - (int)in_R8[5]) * in_R8[2]) * 8) - dVar20;
    dVar12 = *(double *)
              (*in_R8 + ((long)(local_12c4 - (int)in_R8[4]) +
                         (long)(in_ESI - *(int *)((long)in_R8 + 0x24)) * in_R8[1] +
                        (long)(in_EDX - (int)in_R8[5]) * in_R8[2]) * 8) - dVar20;
    dVar13 = dVar8 - dVar1;
    dVar14 = dVar21 - dVar1;
    dVar15 = dVar6 - dVar1;
    dVar16 = dVar9 - dVar2;
    dVar17 = dVar7 - dVar2;
    dVar18 = dVar22 - dVar2;
    dVar19 = dVar13 * dVar15 * dVar17 * dVar18 +
             -(dVar13 * dVar14 * dVar17) * dVar18 +
             -(dVar14 * dVar15 * dVar16) * dVar18 +
             dVar13 * dVar14 * dVar16 * dVar18 +
             -(dVar13 * dVar15 * dVar16) * dVar17 + dVar14 * dVar15 * dVar16 * dVar17;
    local_fe8 = ((dVar10 * dVar14 * dVar18 +
                 -(dVar11 * dVar13) * dVar18 +
                 -(dVar10 * dVar15) * dVar17 +
                 dVar12 * dVar13 * dVar17 + -(dVar12 * dVar14) * dVar16 + dVar11 * dVar15 * dVar16)
                / dVar19) * (0.0 - dVar1) * (0.0 - dVar2) +
                ((dVar11 * dVar13 * dVar15 * (-dVar16 + dVar18) +
                 dVar12 * dVar13 * dVar14 * (dVar16 - dVar17) +
                 dVar10 * dVar14 * dVar15 * (dVar17 - dVar18)) / dVar19) * (0.0 - dVar2) +
                ((dVar10 * (-dVar14 + dVar15) * dVar17 * dVar18 +
                 dVar12 * (-dVar13 + dVar14) * dVar16 * dVar17 +
                 dVar11 * (dVar13 - dVar15) * dVar16 * dVar18) / dVar19) * (0.0 - dVar1) + dVar20;
    dVar20 = *(double *)
              (*(long *)v1_3 +
              ((long)(local_12c4 - *(int *)((long)v1_3 + 0x20)) +
               (long)(local_12c8 - *(int *)((long)v1_3 + 0x24)) * *(long *)((long)v1_3 + 8) +
              (long)(in_EDX - *(int *)((long)v1_3 + 0x28)) * *(long *)((long)v1_3 + 0x10)) * 8) -
             dVar3;
    dVar10 = *(double *)
              (*(long *)v1_3 +
              ((long)(in_EDI - *(int *)((long)v1_3 + 0x20)) +
               (long)(local_12c8 - *(int *)((long)v1_3 + 0x24)) * *(long *)((long)v1_3 + 8) +
              (long)(in_EDX - *(int *)((long)v1_3 + 0x28)) * *(long *)((long)v1_3 + 0x10)) * 8) -
             dVar3;
    dVar11 = *(double *)
              (*(long *)v1_3 +
              ((long)(local_12c4 - *(int *)((long)v1_3 + 0x20)) +
               (long)(in_ESI - *(int *)((long)v1_3 + 0x24)) * *(long *)((long)v1_3 + 8) +
              (long)(in_EDX - *(int *)((long)v1_3 + 0x28)) * *(long *)((long)v1_3 + 0x10)) * 8) -
             dVar3;
    dVar8 = dVar8 - dVar1;
    dVar21 = dVar21 - dVar1;
    dVar6 = dVar6 - dVar1;
    dVar9 = dVar9 - dVar2;
    dVar7 = dVar7 - dVar2;
    dVar22 = dVar22 - dVar2;
    dVar12 = dVar8 * dVar6 * dVar7 * dVar22 +
             -(dVar8 * dVar21 * dVar7) * dVar22 +
             -(dVar21 * dVar6 * dVar9) * dVar22 +
             dVar8 * dVar21 * dVar9 * dVar22 +
             -(dVar8 * dVar6 * dVar9) * dVar7 + dVar21 * dVar6 * dVar9 * dVar7;
    local_1008 = ((dVar20 * dVar21 * dVar22 +
                  -(dVar10 * dVar8) * dVar22 +
                  -(dVar20 * dVar6) * dVar7 +
                  dVar11 * dVar8 * dVar7 + -(dVar11 * dVar21) * dVar9 + dVar10 * dVar6 * dVar9) /
                 dVar12) * (0.0 - dVar1) * (0.0 - dVar2) +
                 ((dVar10 * dVar8 * dVar6 * (-dVar9 + dVar22) +
                  dVar11 * dVar8 * dVar21 * (dVar9 - dVar7) +
                  dVar20 * dVar21 * dVar6 * (dVar7 - dVar22)) / dVar12) * (0.0 - dVar2) +
                 ((dVar20 * (-dVar21 + dVar6) * dVar7 * dVar22 +
                  dVar11 * (-dVar8 + dVar21) * dVar9 * dVar7 +
                  dVar10 * (dVar8 - dVar6) * dVar9 * dVar22) / dVar12) * (0.0 - dVar1) + dVar3;
  }
  else {
    local_fe8 = *(double *)
                 (*in_R8 + ((long)(in_EDI - (int)in_R8[4]) +
                            (long)(in_ESI - *(int *)((long)in_R8 + 0x24)) * in_R8[1] +
                           (long)(in_EDX - (int)in_R8[5]) * in_R8[2]) * 8);
    local_1008 = *(double *)
                  (*(long *)v1_3 +
                  ((long)(in_EDI - *(int *)((long)v1_3 + 0x20)) +
                   (long)(in_ESI - *(int *)((long)v1_3 + 0x24)) * *(long *)((long)v1_3 + 8) +
                  (long)(in_EDX - *(int *)((long)v1_3 + 0x28)) * *(long *)((long)v1_3 + 0x10)) * 8);
  }
  dVar1 = *(double *)
           (*(long *)x1_1 +
           ((long)(in_EDI - *(int *)((long)x1_1 + 0x20)) +
            (long)(in_ESI - *(int *)((long)x1_1 + 0x24)) * *(long *)((long)x1_1 + 8) +
           (long)((in_EDX + 1) - *(int *)((long)x1_1 + 0x28)) * *(long *)((long)x1_1 + 0x10)) * 8);
  if ((dVar1 != 1.0) || (NAN(dVar1))) {
    iVar4 = in_EDX + 1;
    if (0.0 < *(double *)
               (*(long *)v0_3 +
               ((long)(in_EDI - *(int *)((long)v0_3 + 0x20)) +
                (long)(in_ESI - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
               (long)(iVar4 - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10)) * 8)) {
      local_12cc = in_EDI + 1;
    }
    else {
      local_12cc = in_EDI + -1;
    }
    if (0.0 < *(double *)
               (*(long *)v0_3 +
               ((long)(in_EDI - *(int *)((long)v0_3 + 0x20)) +
                (long)(in_ESI - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
                (long)(iVar4 - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10) +
               *(long *)((long)v0_3 + 0x18)) * 8)) {
      local_12d0 = in_ESI + 1;
    }
    else {
      local_12d0 = in_ESI + -1;
    }
    uVar5 = -(ulong)(*(double *)
                      (*(long *)v0_3 +
                      ((long)(in_EDI - *(int *)((long)v0_3 + 0x20)) +
                       (long)(in_ESI - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
                      (long)(iVar4 - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10)) *
                      8) <= 0.0);
    dVar8 = (double)(~uVar5 & 0x3ff0000000000000 | uVar5 & 0xbff0000000000000);
    uVar5 = -(ulong)(*(double *)
                      (*(long *)v0_3 +
                      ((long)(in_EDI - *(int *)((long)v0_3 + 0x20)) +
                       (long)(in_ESI - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
                       (long)(iVar4 - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10) +
                      *(long *)((long)v0_3 + 0x18)) * 8) <= 0.0);
    dVar9 = (double)(~uVar5 & 0x3ff0000000000000 | uVar5 & 0xbff0000000000000);
    dVar1 = *(double *)
             (*(long *)v0_3 +
             ((long)(in_EDI - *(int *)((long)v0_3 + 0x20)) +
              (long)(in_ESI - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
             (long)(iVar4 - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10)) * 8);
    dVar2 = *(double *)
             (*(long *)v0_3 +
             ((long)(in_EDI - *(int *)((long)v0_3 + 0x20)) +
              (long)(in_ESI - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
              (long)(iVar4 - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10) +
             *(long *)((long)v0_3 + 0x18)) * 8);
    dVar20 = *(double *)
              (*in_R8 + ((long)(in_EDI - (int)in_R8[4]) +
                         (long)(in_ESI - *(int *)((long)in_R8 + 0x24)) * in_R8[1] +
                        (long)(iVar4 - (int)in_R8[5]) * in_R8[2]) * 8);
    dVar3 = *(double *)
             (*(long *)v1_3 +
             ((long)(in_EDI - *(int *)((long)v1_3 + 0x20)) +
              (long)(in_ESI - *(int *)((long)v1_3 + 0x24)) * *(long *)((long)v1_3 + 8) +
             (long)(iVar4 - *(int *)((long)v1_3 + 0x28)) * *(long *)((long)v1_3 + 0x10)) * 8);
    dVar6 = *(double *)
             (*(long *)v0_3 +
             ((long)(local_12cc - *(int *)((long)v0_3 + 0x20)) +
              (long)(in_ESI - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
             (long)(iVar4 - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10)) * 8) +
            dVar8;
    dVar22 = *(double *)
              (*(long *)v0_3 +
              ((long)(local_12cc - *(int *)((long)v0_3 + 0x20)) +
               (long)(in_ESI - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
               (long)(iVar4 - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10) +
              *(long *)((long)v0_3 + 0x18)) * 8);
    dVar21 = *(double *)
              (*(long *)v0_3 +
              ((long)(in_EDI - *(int *)((long)v0_3 + 0x20)) +
               (long)(local_12d0 - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
              (long)(iVar4 - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10)) * 8);
    dVar7 = *(double *)
             (*(long *)v0_3 +
             ((long)(in_EDI - *(int *)((long)v0_3 + 0x20)) +
              (long)(local_12d0 - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
              (long)(iVar4 - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10) +
             *(long *)((long)v0_3 + 0x18)) * 8) + dVar9;
    dVar8 = *(double *)
             (*(long *)v0_3 +
             ((long)(local_12cc - *(int *)((long)v0_3 + 0x20)) +
              (long)(local_12d0 - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
             (long)(iVar4 - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10)) * 8) +
            dVar8;
    dVar9 = *(double *)
             (*(long *)v0_3 +
             ((long)(local_12cc - *(int *)((long)v0_3 + 0x20)) +
              (long)(local_12d0 - *(int *)((long)v0_3 + 0x24)) * *(long *)((long)v0_3 + 8) +
              (long)(iVar4 - *(int *)((long)v0_3 + 0x28)) * *(long *)((long)v0_3 + 0x10) +
             *(long *)((long)v0_3 + 0x18)) * 8) + dVar9;
    dVar10 = *(double *)
              (*in_R8 + ((long)(local_12cc - (int)in_R8[4]) +
                         (long)(local_12d0 - *(int *)((long)in_R8 + 0x24)) * in_R8[1] +
                        (long)(iVar4 - (int)in_R8[5]) * in_R8[2]) * 8) - dVar20;
    dVar11 = *(double *)
              (*in_R8 + ((long)(in_EDI - (int)in_R8[4]) +
                         (long)(local_12d0 - *(int *)((long)in_R8 + 0x24)) * in_R8[1] +
                        (long)(iVar4 - (int)in_R8[5]) * in_R8[2]) * 8) - dVar20;
    dVar12 = *(double *)
              (*in_R8 + ((long)(local_12cc - (int)in_R8[4]) +
                         (long)(in_ESI - *(int *)((long)in_R8 + 0x24)) * in_R8[1] +
                        (long)(iVar4 - (int)in_R8[5]) * in_R8[2]) * 8) - dVar20;
    dVar13 = dVar8 - dVar1;
    dVar14 = dVar21 - dVar1;
    dVar15 = dVar6 - dVar1;
    dVar16 = dVar9 - dVar2;
    dVar17 = dVar7 - dVar2;
    dVar18 = dVar22 - dVar2;
    dVar19 = dVar13 * dVar15 * dVar17 * dVar18 +
             -(dVar13 * dVar14 * dVar17) * dVar18 +
             -(dVar14 * dVar15 * dVar16) * dVar18 +
             dVar13 * dVar14 * dVar16 * dVar18 +
             -(dVar13 * dVar15 * dVar16) * dVar17 + dVar14 * dVar15 * dVar16 * dVar17;
    local_ff0 = ((dVar10 * dVar14 * dVar18 +
                 -(dVar11 * dVar13) * dVar18 +
                 -(dVar10 * dVar15) * dVar17 +
                 dVar12 * dVar13 * dVar17 + -(dVar12 * dVar14) * dVar16 + dVar11 * dVar15 * dVar16)
                / dVar19) * (0.0 - dVar1) * (0.0 - dVar2) +
                ((dVar11 * dVar13 * dVar15 * (-dVar16 + dVar18) +
                 dVar12 * dVar13 * dVar14 * (dVar16 - dVar17) +
                 dVar10 * dVar14 * dVar15 * (dVar17 - dVar18)) / dVar19) * (0.0 - dVar2) +
                ((dVar10 * (-dVar14 + dVar15) * dVar17 * dVar18 +
                 dVar12 * (-dVar13 + dVar14) * dVar16 * dVar17 +
                 dVar11 * (dVar13 - dVar15) * dVar16 * dVar18) / dVar19) * (0.0 - dVar1) + dVar20;
    dVar20 = *(double *)
              (*(long *)v1_3 +
              ((long)(local_12cc - *(int *)((long)v1_3 + 0x20)) +
               (long)(local_12d0 - *(int *)((long)v1_3 + 0x24)) * *(long *)((long)v1_3 + 8) +
              (long)(iVar4 - *(int *)((long)v1_3 + 0x28)) * *(long *)((long)v1_3 + 0x10)) * 8) -
             dVar3;
    dVar10 = *(double *)
              (*(long *)v1_3 +
              ((long)(in_EDI - *(int *)((long)v1_3 + 0x20)) +
               (long)(local_12d0 - *(int *)((long)v1_3 + 0x24)) * *(long *)((long)v1_3 + 8) +
              (long)(iVar4 - *(int *)((long)v1_3 + 0x28)) * *(long *)((long)v1_3 + 0x10)) * 8) -
             dVar3;
    dVar11 = *(double *)
              (*(long *)v1_3 +
              ((long)(local_12cc - *(int *)((long)v1_3 + 0x20)) +
               (long)(in_ESI - *(int *)((long)v1_3 + 0x24)) * *(long *)((long)v1_3 + 8) +
              (long)(iVar4 - *(int *)((long)v1_3 + 0x28)) * *(long *)((long)v1_3 + 0x10)) * 8) -
             dVar3;
    dVar8 = dVar8 - dVar1;
    dVar21 = dVar21 - dVar1;
    dVar6 = dVar6 - dVar1;
    dVar9 = dVar9 - dVar2;
    dVar7 = dVar7 - dVar2;
    dVar22 = dVar22 - dVar2;
    dVar12 = dVar8 * dVar6 * dVar7 * dVar22 +
             -(dVar8 * dVar21 * dVar7) * dVar22 +
             -(dVar21 * dVar6 * dVar9) * dVar22 +
             dVar8 * dVar21 * dVar9 * dVar22 +
             -(dVar8 * dVar6 * dVar9) * dVar7 + dVar21 * dVar6 * dVar9 * dVar7;
    local_1010 = ((dVar20 * dVar21 * dVar22 +
                  -(dVar10 * dVar8) * dVar22 +
                  -(dVar20 * dVar6) * dVar7 +
                  dVar11 * dVar8 * dVar7 + -(dVar11 * dVar21) * dVar9 + dVar10 * dVar6 * dVar9) /
                 dVar12) * (0.0 - dVar1) * (0.0 - dVar2) +
                 ((dVar10 * dVar8 * dVar6 * (-dVar9 + dVar22) +
                  dVar11 * dVar8 * dVar21 * (dVar9 - dVar7) +
                  dVar20 * dVar21 * dVar6 * (dVar7 - dVar22)) / dVar12) * (0.0 - dVar2) +
                 ((dVar20 * (-dVar21 + dVar6) * dVar7 * dVar22 +
                  dVar11 * (-dVar8 + dVar21) * dVar9 * dVar7 +
                  dVar10 * (dVar8 - dVar6) * dVar9 * dVar22) / dVar12) * (0.0 - dVar1) + dVar3;
  }
  else {
    local_ff0 = *(double *)
                 (*in_R8 + ((long)(in_EDI - (int)in_R8[4]) +
                            (long)(in_ESI - *(int *)((long)in_R8 + 0x24)) * in_R8[1] +
                           (long)((in_EDX + 1) - (int)in_R8[5]) * in_R8[2]) * 8);
    local_1010 = *(double *)
                  (*(long *)v1_3 +
                  ((long)(in_EDI - *(int *)((long)v1_3 + 0x20)) +
                   (long)(in_ESI - *(int *)((long)v1_3 + 0x24)) * *(long *)((long)v1_3 + 8) +
                  (long)((in_EDX + 1) - *(int *)((long)v1_3 + 0x28)) * *(long *)((long)v1_3 + 0x10))
                  * 8);
  }
  *(double *)y0_3 = ((local_fe0 + local_fd8) * 0.5 * (local_1000 - local_ff8)) / in_XMM0_Qa;
  *(double *)x0_1 = ((local_ff0 + local_fe8) * 0.5 * (local_1010 - local_1008)) / in_XMM1_Qa;
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE AMREX_INLINE
void create_transverse_terms_for_yface(int i, int jc, int k,
                                       Array4<Real const> const& u_ad,
                                       Array4<Real const> const& w_ad,
                                       Array4<Real const> const& xzlo,
                                       Array4<Real const> const& zxlo,
                                       Array4<Real const> const& apx,
                                       Array4<Real const> const& apz,
                                       Array4<Real const> const& fcx,
                                       Array4<Real const> const& fcz,
                                       Real& trans_x, Real& trans_z,
                                       const Real dx, const Real dz)
{
    Real u_tmp_i, u_tmp_ip1;
    Real w_tmp_k, w_tmp_kp1;
    Real x_hat_i, x_hat_ip1;
    Real z_hat_k, z_hat_kp1;

    // Tangential extrapolation in the y- and z-directions at i-1/2
    if (apx(i,jc,k) == 1.0)
    {
        u_tmp_i = u_ad(i,jc,k);
        x_hat_i = xzlo(i,jc,k);

    } else {

        int ic = i;
        int kc = k;

        int jj = (fcx(ic,jc,kc,0) <= 0.0) ? jc-1 : jc+1;
        int kk = (fcx(ic,jc,kc,1) <= 0.0) ? kc-1 : kc+1;

        Real yoff = (fcx(ic,jc,kc,0) <= 0.0) ? -1. : 1.;
        Real zoff = (fcx(ic,jc,kc,1) <= 0.0) ? -1. : 1.;

        Real y0 =  fcx(ic,jc,kc,0);
        Real z0 =  fcx(ic,jc,kc,1);
        Real v0 = u_ad(ic,jc,kc  ); Real h0 = xzlo(ic,jc,kc);

        Real y1 =  fcx(ic,jj,kc,0)+yoff;
        Real z1 =  fcx(ic,jj,kc,1);
        Real v1 = u_ad(ic,jj,kc  ); Real h1 = xzlo(ic,jj,kc);

        Real y2 =  fcx(ic,jc,kk,0);
        Real z2 =  fcx(ic,jc,kk,1)+zoff;
        Real v2 = u_ad(ic,jc,kk  ); Real h2 = xzlo(ic,jc,kk);

        Real y3 =  fcx(ic,jj,kk,0)+yoff;
        Real z3 =  fcx(ic,jj,kk,1)+zoff;
        Real v3 = u_ad(ic,jj,kk  ); Real h3 = xzlo(ic,jj,kk);

        u_tmp_i = EB_interp_in_quad(0.,0.,v0,v1,v2,v3,y0,z0,y1,z1,y2,z2,y3,z3);
        x_hat_i = EB_interp_in_quad(0.,0.,h0,h1,h2,h3,y0,z0,y1,z1,y2,z2,y3,z3);
    }

    // Tangential extrapolation in the y- and z-directions at i+1/2
    if (apx(i+1,jc,k) == 1.0)
    {
        u_tmp_ip1 = u_ad(i+1,jc,k);
        x_hat_ip1 = xzlo(i+1,jc,k);

    } else {

        int ic = i+1;
        int kc = k;

        int jj = (fcx(ic,jc,kc,0) <= 0.0) ? jc-1 : jc+1;
        int kk = (fcx(ic,jc,kc,1) <= 0.0) ? kc-1 : kc+1;

        Real yoff = (fcx(ic,jc,kc,0) <= 0.0) ? -1. : 1.;
        Real zoff = (fcx(ic,jc,kc,1) <= 0.0) ? -1. : 1.;

        Real y0 =  fcx(ic,jc,kc,0);
        Real z0 =  fcx(ic,jc,kc,1);
        Real v0 = u_ad(ic,jc,kc  ); Real h0 = xzlo(ic,jc,kc);

        Real y1 =  fcx(ic,jj,kc,0)+yoff;
        Real z1 =  fcx(ic,jj,kc,1);
        Real v1 = u_ad(ic,jj,kc  ); Real h1 = xzlo(ic,jj,kc);

        Real y2 =  fcx(ic,jc,kk,0);
        Real z2 =  fcx(ic,jc,kk,1)+zoff;
        Real v2 = u_ad(ic,jc,kk  ); Real h2 = xzlo(ic,jc,kk);

        Real y3 =  fcx(ic,jj,kk,0)+yoff;
        Real z3 =  fcx(ic,jj,kk,1)+zoff;
        Real v3 = u_ad(ic,jj,kk  ); Real h3 = xzlo(ic,jj,kk);

        u_tmp_ip1 = EB_interp_in_quad(0.,0.,v0,v1,v2,v3,y0,z0,y1,z1,y2,z2,y3,z3);
        x_hat_ip1 = EB_interp_in_quad(0.,0.,h0,h1,h2,h3,y0,z0,y1,z1,y2,z2,y3,z3);
    }

    // Tangential extrapolation in the x- and y-directions at k-1/2
    if (apz(i,jc,k) == 1.0)
    {
        w_tmp_k = w_ad(i,jc,k);
        z_hat_k = zxlo(i,jc,k);

    } else {

        int ic = i;
        int kc = k;

        int ii = (fcz(ic,jc,kc,0) <= 0.0) ? ic-1 : ic+1;
        int jj = (fcz(ic,jc,kc,1) <= 0.0) ? jc-1 : jc+1;

        Real xoff = (fcz(ic,jc,kc,0) <= 0.0) ? -1. : 1.;
        Real yoff = (fcz(ic,jc,kc,1) <= 0.0) ? -1. : 1.;

        Real x0 =  fcz(ic,jc,kc,0);
        Real y0 =  fcz(ic,jc,kc,1);
        Real v0 = w_ad(ic,jc,kc  ); Real h0 = zxlo(ic,jc,kc);

        Real x1 =  fcz(ii,jc,kc,0)+xoff;
        Real y1 =  fcz(ii,jc,kc,1);
        Real v1 = w_ad(ii,jc,kc  ); Real h1 = zxlo(ii,jc,kc);

        Real x2 =  fcz(ic,jj,kc,0);
        Real y2 =  fcz(ic,jj,kc,1)+yoff;
        Real v2 = w_ad(ic,jj,kc  ); Real h2 = zxlo(ic,jj,kc);

        Real x3 =  fcz(ii,jj,kc,0)+xoff;
        Real y3 =  fcz(ii,jj,kc,1)+yoff;
        Real v3 = w_ad(ii,jj,kc  ); Real h3 = zxlo(ii,jj,kc);

        w_tmp_k = EB_interp_in_quad(0.,0.,v0,v1,v2,v3,x0,y0,x1,y1,x2,y2,x3,y3);
        z_hat_k = EB_interp_in_quad(0.,0.,h0,h1,h2,h3,x0,y0,x1,y1,x2,y2,x3,y3);
    }

    // Tangential extrapolation in the x- and y-directions at k+1/2
    if (apz(i,jc,k+1) == 1.0)
    {
        w_tmp_kp1 = w_ad(i,jc,k+1);
        z_hat_kp1 = zxlo(i,jc,k+1);

    } else {

        int ic = i;
        int kc = k+1;

        int ii = (fcz(ic,jc,kc,0) <= 0.0) ? ic-1 : ic+1;
        int jj = (fcz(ic,jc,kc,1) <= 0.0) ? jc-1 : jc+1;

        Real xoff = (fcz(ic,jc,kc,0) <= 0.0) ? -1. : 1.;
        Real yoff = (fcz(ic,jc,kc,1) <= 0.0) ? -1. : 1.;

        Real x0 =  fcz(ic,jc,kc,0);
        Real y0 =  fcz(ic,jc,kc,1);
        Real v0 = w_ad(ic,jc,kc  ); Real h0 = zxlo(ic,jc,kc);

        Real x1 =  fcz(ii,jc,kc,0)+xoff;
        Real y1 =  fcz(ii,jc,kc,1);
        Real v1 = w_ad(ii,jc,kc  ); Real h1 = zxlo(ii,jc,kc);

        Real x2 =  fcz(ic,jj,kc,0);
        Real y2 =  fcz(ic,jj,kc,1)+yoff;
        Real v2 = w_ad(ic,jj,kc  ); Real h2 = zxlo(ic,jj,kc);

        Real x3 =  fcz(ii,jj,kc,0)+xoff;
        Real y3 =  fcz(ii,jj,kc,1)+yoff;
        Real v3 = w_ad(ii,jj,kc  ); Real h3 = zxlo(ii,jj,kc);

        w_tmp_kp1 = EB_interp_in_quad(0.,0.,v0,v1,v2,v3,x0,y0,x1,y1,x2,y2,x3,y3);
        z_hat_kp1 = EB_interp_in_quad(0.,0.,h0,h1,h2,h3,x0,y0,x1,y1,x2,y2,x3,y3);
    }

    Real u_tmp_l = 0.5 * (u_tmp_ip1 + u_tmp_i);
    Real  dudx_l =       (x_hat_ip1 - x_hat_i);

    Real w_tmp_l = 0.5 * (w_tmp_kp1 + w_tmp_k);
    Real  dudz_l =       (z_hat_kp1 - z_hat_k);

    trans_x = u_tmp_l * dudx_l / dx;
    trans_z = w_tmp_l * dudz_l / dz;
}